

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall
ImVector<ImGuiListClipperRange>::push_front
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiListClipperRange *pIVar4;
  ImS8 IVar5;
  ImS8 IVar6;
  undefined1 uVar7;
  ImGuiListClipperRange *pIVar8;
  int iVar9;
  int iVar10;
  
  iVar2 = this->Size;
  if (iVar2 == 0) {
    if (this->Capacity == 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar8 = (ImGuiListClipperRange *)(*GImAllocatorAllocFunc)(0x60,GImAllocatorUserData);
      if (this->Data != (ImGuiListClipperRange *)0x0) {
        memcpy(pIVar8,this->Data,(long)this->Size * 0xc);
        pIVar4 = this->Data;
        if ((pIVar4 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      this->Data = pIVar8;
      this->Capacity = 8;
    }
    pIVar8 = this->Data + this->Size;
  }
  else {
    iVar3 = this->Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar3 / 2 + iVar3;
      }
      iVar10 = iVar2 + 1;
      if (iVar2 + 1 < iVar9) {
        iVar10 = iVar9;
      }
      if (iVar3 < iVar10) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar8 = (ImGuiListClipperRange *)
                 (*GImAllocatorAllocFunc)((long)iVar10 * 0xc,GImAllocatorUserData);
        if (this->Data != (ImGuiListClipperRange *)0x0) {
          memcpy(pIVar8,this->Data,(long)this->Size * 0xc);
          pIVar4 = this->Data;
          if ((pIVar4 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
        }
        this->Data = pIVar8;
        this->Capacity = iVar10;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size * 0xc);
    }
    pIVar8 = this->Data;
  }
  IVar5 = v->PosToIndexOffsetMin;
  IVar6 = v->PosToIndexOffsetMax;
  uVar7 = v->field_0xb;
  pIVar8->PosToIndexConvert = v->PosToIndexConvert;
  pIVar8->PosToIndexOffsetMin = IVar5;
  pIVar8->PosToIndexOffsetMax = IVar6;
  pIVar8->field_0xb = uVar7;
  iVar2 = v->Max;
  pIVar8->Min = v->Min;
  pIVar8->Max = iVar2;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }